

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O3

int Abc_CommandDualRail(Abc_Frame_t *pAbc,int argc,char **argv)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  uint fCheckOne;
  uint fCheckZero;
  Abc_Ntk_t *pNtk;
  Vec_Int_t *vDcFlops;
  Aig_Man_t *pAig;
  Aig_Man_t *pMan;
  Abc_Ntk_t *pNtk_00;
  char *pcVar5;
  uint fComplPo;
  char *pcVar6;
  char *pcVar7;
  uint local_5c;
  uint local_54;
  uint local_50;
  
  local_50 = 0;
  Extra_UtilGetoptReset();
  local_54 = 0;
  bVar1 = false;
  local_5c = 0;
  fComplPo = 0;
  fCheckZero = 0;
  fCheckOne = 0;
  bVar2 = false;
LAB_002764d5:
  while (iVar4 = Extra_UtilGetopt(argc,argv,"Itxfczovh"), iVar3 = globalUtilOptind, iVar4 < 0x66) {
    if (iVar4 == 0x49) {
      if (argc <= globalUtilOptind) {
        Abc_Print(-1,"Command line switch \"-I\" should be followed by an integer.\n");
        goto LAB_00276609;
      }
      local_50 = atoi(argv[globalUtilOptind]);
      globalUtilOptind = iVar3 + 1;
      if ((int)local_50 < 0) {
LAB_00276609:
        Abc_Print(-2,"usage: dualrail [-I num] [-txfczovh]\n");
        Abc_Print(-2,"\t         transforms the current AIG into a dual-rail miter\n");
        Abc_Print(-2,"\t         expressing the property \"at least one PO has ternary value\"\n");
        Abc_Print(-2,"\t         (to compute an initialization sequence, use switches \"-tfc\")\n");
        Abc_Print(-2,"\t-I num : the number of first PIs interpreted as ternary [default = %d]\n",
                  (ulong)local_50);
        pcVar7 = "const0 init values";
        pcVar6 = "yes";
        pcVar5 = "yes";
        if (local_54 == 0) {
          pcVar5 = "const0 init values";
        }
        Abc_Print(-2,"\t-t     : toggle ternary flop init values for all flops [default = %s]\n",
                  pcVar5);
        if (bVar1) {
          pcVar7 = "yes";
        }
        Abc_Print(-2,
                  "\t-x     : toggle ternary flop init values for DC-valued flops [default = %s]\n",
                  pcVar7);
        pcVar5 = "flops";
        if (local_5c == 0) {
          pcVar5 = "POs";
        }
        Abc_Print(-2,"\t-f     : toggle mitering flops instead of POs [default = %s]\n",pcVar5);
        pcVar5 = "yes";
        if (fComplPo == 0) {
          pcVar5 = "no";
        }
        Abc_Print(-2,"\t-c     : toggle complementing the miter output [default = %s]\n",pcVar5);
        pcVar5 = "yes";
        if (fCheckZero == 0) {
          pcVar5 = "no";
        }
        Abc_Print(-2,"\t-z     : toggle checking PO==0 instead of PO==X [default = %s]\n",pcVar5);
        pcVar5 = "yes";
        if (fCheckOne == 0) {
          pcVar5 = "no";
        }
        Abc_Print(-2,"\t-o     : toggle checking PO==1 instead of PO==X [default = %s]\n",pcVar5);
        if (!bVar2) {
          pcVar6 = "no";
        }
        Abc_Print(-2,"\t-v     : toggle printing optimization summary [default = %s]\n",pcVar6);
        Abc_Print(-2,"\t-h     : print the command usage\n");
        return 1;
      }
    }
    else {
      if (iVar4 != 99) {
        if (iVar4 == -1) {
          pNtk = Abc_FrameReadNtk(pAbc);
          if (pNtk == (Abc_Ntk_t *)0x0) {
            pcVar5 = "Main AIG: There is no current network.\n";
          }
          else {
            if (pNtk->ntkType == ABC_NTK_STRASH) {
              if (bVar1) {
                vDcFlops = Abc_NtkFindDcLatches(pNtk);
              }
              else {
                vDcFlops = (Vec_Int_t *)0x0;
              }
              pAig = Abc_NtkToDar(pNtk,0,1);
              pMan = Saig_ManDupDual(pAig,vDcFlops,local_50,local_54,local_5c,fComplPo,fCheckZero,
                                     fCheckOne);
              Aig_ManStop(pAig);
              pNtk_00 = Abc_NtkFromAigPhase(pMan);
              pcVar5 = Extra_UtilStrsav(pNtk->pName);
              pNtk_00->pName = pcVar5;
              Aig_ManStop(pMan);
              if (vDcFlops != (Vec_Int_t *)0x0) {
                if (vDcFlops->pArray != (int *)0x0) {
                  free(vDcFlops->pArray);
                }
                free(vDcFlops);
              }
              Abc_FrameReplaceCurrentNetwork(pAbc,pNtk_00);
              return 0;
            }
            pcVar5 = "Main AIG: The current network is not an AIG.\n";
          }
          Abc_Print(1,pcVar5);
          return 0;
        }
        goto switchD_002764f7_caseD_70;
      }
      fComplPo = fComplPo ^ 1;
    }
  }
  switch(iVar4) {
  case 0x6f:
    fCheckOne = fCheckOne ^ 1;
    goto LAB_002764d5;
  case 0x70:
  case 0x71:
  case 0x72:
  case 0x73:
  case 0x75:
  case 0x77:
  case 0x79:
    goto switchD_002764f7_caseD_70;
  case 0x74:
    local_54 = local_54 ^ 1;
    goto LAB_002764d5;
  case 0x76:
    bVar2 = (bool)(bVar2 ^ 1);
    goto LAB_002764d5;
  case 0x78:
    bVar1 = (bool)(bVar1 ^ 1);
    goto LAB_002764d5;
  case 0x7a:
    fCheckZero = fCheckZero ^ 1;
    goto LAB_002764d5;
  default:
    if (iVar4 == 0x66) {
      local_5c = local_5c ^ 1;
      goto LAB_002764d5;
    }
    if (iVar4 == 0x68) goto LAB_00276609;
switchD_002764f7_caseD_70:
    Abc_Print(-2,"Unknown switch.\n");
    goto LAB_00276609;
  }
}

Assistant:

int Abc_CommandDualRail( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    extern Vec_Int_t * Abc_NtkFindDcLatches( Abc_Ntk_t * pNtk );
    Abc_Ntk_t * pNtk, * pNtkNew = NULL;
    Aig_Man_t * pAig, * pAigNew;
    Vec_Int_t * vDcFlops = NULL;
    int c;
    int nDualPis   = 0;
    int fDualFfs   = 0;
    int fDualDcFfs = 0;
    int fMiterFfs  = 0;
    int fComplPo   = 0;
    int fCheckZero = 0;
    int fCheckOne  = 0;
    int fVerbose   = 0;
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "Itxfczovh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'I':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-I\" should be followed by an integer.\n" );
                goto usage;
            }
            nDualPis = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( nDualPis < 0 )
                goto usage;
            break;
        case 't':
            fDualFfs ^= 1;
            break;
        case 'x':
            fDualDcFfs ^= 1;
            break;
        case 'f':
            fMiterFfs ^= 1;
            break;
        case 'c':
            fComplPo ^= 1;
            break;
        case 'z':
            fCheckZero ^= 1;
            break;
        case 'o':
            fCheckOne ^= 1;
            break;
        case 'v':
            fVerbose ^= 1;
            break;
        case 'h':
            goto usage;
        default:
            Abc_Print( -2, "Unknown switch.\n");
            goto usage;
        }
    }

    // check the main AIG
    pNtk = Abc_FrameReadNtk(pAbc);
    if ( pNtk == NULL )
    {
        Abc_Print( 1, "Main AIG: There is no current network.\n");
        return 0;
    }
    if ( !Abc_NtkIsStrash(pNtk) )
    {
        Abc_Print( 1, "Main AIG: The current network is not an AIG.\n");
        return 0;
    }

    if ( fDualDcFfs )
        vDcFlops = Abc_NtkFindDcLatches( pNtk );

    // transform
    pAig = Abc_NtkToDar( pNtk, 0, 1 );
    pAigNew = Saig_ManDupDual( pAig, vDcFlops, nDualPis, fDualFfs, fMiterFfs, fComplPo, fCheckZero, fCheckOne );
    Aig_ManStop( pAig );
    pNtkNew = Abc_NtkFromAigPhase( pAigNew );
    pNtkNew->pName = Extra_UtilStrsav(pNtk->pName);
    Aig_ManStop( pAigNew );
    Vec_IntFreeP( &vDcFlops );

    // replace the current network
    Abc_FrameReplaceCurrentNetwork( pAbc, pNtkNew );
    return 0;

usage:
    Abc_Print( -2, "usage: dualrail [-I num] [-txfczovh]\n" );
    Abc_Print( -2, "\t         transforms the current AIG into a dual-rail miter\n" );
    Abc_Print( -2, "\t         expressing the property \"at least one PO has ternary value\"\n" );
    Abc_Print( -2, "\t         (to compute an initialization sequence, use switches \"-tfc\")\n" );
    Abc_Print( -2, "\t-I num : the number of first PIs interpreted as ternary [default = %d]\n", nDualPis );
    Abc_Print( -2, "\t-t     : toggle ternary flop init values for all flops [default = %s]\n", fDualFfs? "yes": "const0 init values" );
    Abc_Print( -2, "\t-x     : toggle ternary flop init values for DC-valued flops [default = %s]\n", fDualDcFfs? "yes": "const0 init values" );
    Abc_Print( -2, "\t-f     : toggle mitering flops instead of POs [default = %s]\n", fMiterFfs? "flops": "POs" );
    Abc_Print( -2, "\t-c     : toggle complementing the miter output [default = %s]\n", fComplPo? "yes": "no" );
    Abc_Print( -2, "\t-z     : toggle checking PO==0 instead of PO==X [default = %s]\n", fCheckZero? "yes": "no" );
    Abc_Print( -2, "\t-o     : toggle checking PO==1 instead of PO==X [default = %s]\n", fCheckOne? "yes": "no" );
    Abc_Print( -2, "\t-v     : toggle printing optimization summary [default = %s]\n", fVerbose? "yes": "no" );
    Abc_Print( -2, "\t-h     : print the command usage\n");
    return 1;
}